

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::wallet_tests::BasicOutputTypesTest::test_method(BasicOutputTypesTest *this)

{
  bool bVar1;
  const_iterator pvVar2;
  mapped_type_conflict5 *pmVar3;
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  *expected_coins_sizes_00;
  long in_FS_OFFSET;
  value_type *out_type_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  array<OutputType,_4UL> *__range2_1;
  value_type *out_type;
  const_iterator __end2;
  const_iterator __begin2;
  array<OutputType,_4UL> *__range2;
  CoinsResult available_coins;
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  expected_coins_sizes;
  char *in_stack_fffffffffffffdc8;
  lazy_ostream *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  CoinsResult *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  lazy_ostream *in_stack_fffffffffffffdf8;
  const_string *in_stack_fffffffffffffe00;
  lazy_ostream *in_stack_fffffffffffffe08;
  const_iterator local_198;
  const_iterator local_168;
  CAmount in_stack_fffffffffffffec0;
  OutputType in_stack_fffffffffffffecc;
  ListCoinsTest *in_stack_fffffffffffffed0;
  size_t local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [76];
  undefined4 local_84;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  ::map((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
         *)in_stack_fffffffffffffdc8);
  local_168 = std::array<OutputType,_4UL>::begin
                        ((array<OutputType,_4UL> *)in_stack_fffffffffffffdc8);
  pvVar2 = std::array<OutputType,_4UL>::end((array<OutputType,_4UL> *)in_stack_fffffffffffffdc8);
  for (; local_168 != pvVar2; local_168 = local_168 + 1) {
    pmVar3 = std::
             map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
             ::operator[]((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                           *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                          (key_type *)in_stack_fffffffffffffde8);
    *pmVar3 = 0;
  }
  local_84 = 4;
  pmVar3 = std::
           map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
           ::operator[]((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                        (key_type *)in_stack_fffffffffffffde8);
  *pmVar3 = 1;
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffdc8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdc8);
  test_method::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffdf8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (size_t)in_stack_fffffffffffffdf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    local_e8 = CoinsResult::Size(in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdd0 =
         (lazy_ostream *)
         std::
         map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
         ::operator[]((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                       *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      (key_type *)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdd8 = "expected_coins_sizes[OutputType::UNKNOWN]";
    in_stack_fffffffffffffdc8 = "available_coins.Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d0,local_e0,0x2be,1,2,&local_e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (size_t)in_stack_fffffffffffffdf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    in_stack_fffffffffffffe08 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffe00 =
         (const_string *)
         std::
         map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
         ::operator[]((map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      (key_type *)in_stack_fffffffffffffde8);
    expected_coins_sizes_00 =
         (map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
          *)std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::size
                      ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                       in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdd0 =
         (lazy_ostream *)
         std::
         map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
         ::operator[]((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                       *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      (key_type *)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdd8 = "expected_coins_sizes[OutputType::UNKNOWN]";
    in_stack_fffffffffffffdc8 = "available_coins.coins[OutputType::UNKNOWN].size()";
    in_stack_fffffffffffffdf8 = in_stack_fffffffffffffdd0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&stack0xfffffffffffffed0,&stack0xfffffffffffffec0,0x2bf,1,2,&stack0xfffffffffffffeb8)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdf7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffdf7);
  local_198 = std::array<OutputType,_4UL>::begin
                        ((array<OutputType,_4UL> *)in_stack_fffffffffffffdc8);
  pvVar2 = std::array<OutputType,_4UL>::end((array<OutputType,_4UL> *)in_stack_fffffffffffffdc8);
  for (; local_198 != pvVar2; local_198 = local_198 + 1) {
    if (*local_198 != UNKNOWN) {
      in_stack_fffffffffffffde8 =
           (CoinsResult *)
           std::
           map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
           ::operator[]((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                        (key_type *)in_stack_fffffffffffffde8);
      *(mapped_type_conflict5 *)&(in_stack_fffffffffffffde8->coins)._M_t._M_impl = 2;
      TestCoinsResult(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                      expected_coins_sizes_00);
    }
  }
  CoinsResult::~CoinsResult((CoinsResult *)in_stack_fffffffffffffdc8);
  std::
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  ::~map((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
          *)in_stack_fffffffffffffdc8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(BasicOutputTypesTest, ListCoinsTest)
{
    std::map<OutputType, size_t> expected_coins_sizes;
    for (const auto& out_type : OUTPUT_TYPES) { expected_coins_sizes[out_type] = 0U; }

    // Verify our wallet has one usable coinbase UTXO before starting
    // This UTXO is a P2PK, so it should show up in the Other bucket
    expected_coins_sizes[OutputType::UNKNOWN] = 1U;
    CoinsResult available_coins = WITH_LOCK(wallet->cs_wallet, return AvailableCoins(*wallet));
    BOOST_CHECK_EQUAL(available_coins.Size(), expected_coins_sizes[OutputType::UNKNOWN]);
    BOOST_CHECK_EQUAL(available_coins.coins[OutputType::UNKNOWN].size(), expected_coins_sizes[OutputType::UNKNOWN]);

    // We will create a self transfer for each of the OutputTypes and
    // verify it is put in the correct bucket after running GetAvailablecoins
    //
    // For each OutputType, We expect 2 UTXOs in our wallet following the self transfer:
    //   1. One UTXO as the recipient
    //   2. One UTXO from the change, due to payment address matching logic

    for (const auto& out_type : OUTPUT_TYPES) {
        if (out_type == OutputType::UNKNOWN) continue;
        expected_coins_sizes[out_type] = 2U;
        TestCoinsResult(*this, out_type, 1 * COIN, expected_coins_sizes);
    }
}